

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDockNode(ImGuiDockNode *node,char *label)

{
  bool bVar1;
  ImVec4 *col;
  char *pcVar2;
  ImDrawList *this;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ImVec2 *lhs;
  char *pcVar6;
  char *pcVar7;
  ImGuiWindow *local_b0;
  char *local_a8;
  char *local_98;
  char *local_70;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiWindow *local_30;
  ImGuiWindow *window;
  bool open;
  bool is_active;
  ImGuiContext *pIStack_20;
  bool is_alive;
  ImGuiContext *g;
  char *label_local;
  ImGuiDockNode *node_local;
  
  pIStack_20 = GImGui;
  window._7_1_ = GImGui->FrameCount - node->LastFrameAlive < 2;
  window._6_1_ = GImGui->FrameCount - node->LastFrameActive < 2;
  g = (ImGuiContext *)label;
  label_local = (char *)node;
  if (!(bool)window._7_1_) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  if (*(int *)(label_local + 0x30) < 1) {
    pcVar2 = " (hidden)";
    if (((byte)((ushort)*(undefined2 *)(label_local + 0xbc) >> 9) & 1) != 0) {
      pcVar2 = "";
    }
    if (*(int *)(label_local + 0x60) == 0) {
      local_98 = "horizontal";
    }
    else {
      local_98 = "n/a";
      if (*(int *)(label_local + 0x60) == 1) {
        local_98 = "vertical";
      }
    }
    if (*(long *)(label_local + 0x88) == 0) {
      local_a8 = "NULL";
    }
    else {
      local_a8 = (char *)**(undefined8 **)(label_local + 0x88);
    }
    window._5_1_ = TreeNode((void *)(ulong)*(uint *)label_local,
                            "%s 0x%04X%s: %s split (vis: \'%s\')",g,(ulong)*(uint *)label_local,
                            pcVar2,local_98,local_a8);
  }
  else {
    pcVar2 = " (hidden)";
    if (((byte)((ushort)*(undefined2 *)(label_local + 0xbc) >> 9) & 1) != 0) {
      pcVar2 = "";
    }
    if (*(long *)(label_local + 0x88) == 0) {
      local_70 = "NULL";
    }
    else {
      local_70 = (char *)**(undefined8 **)(label_local + 0x88);
    }
    window._5_1_ = TreeNode((void *)(ulong)*(uint *)label_local,
                            "%s 0x%04X%s: %d windows (vis: \'%s\')",g,(ulong)*(uint *)label_local,
                            pcVar2,(ulong)*(uint *)(label_local + 0x30),local_70);
  }
  if ((window._7_1_ & 1) == 0) {
    PopStyleColor(1);
  }
  if (((window._6_1_ & 1) != 0) && (bVar1 = IsItemHovered(0), bVar1)) {
    if (*(long *)(label_local + 0x80) == 0) {
      local_b0 = *(ImGuiWindow **)(label_local + 0x88);
    }
    else {
      local_b0 = *(ImGuiWindow **)(label_local + 0x80);
    }
    local_30 = local_b0;
    if (local_b0 != (ImGuiWindow *)0x0) {
      this = GetForegroundDrawList(local_b0);
      lhs = (ImVec2 *)(label_local + 0x48);
      local_38 = operator+(lhs,(ImVec2 *)(label_local + 0x50));
      ImDrawList::AddRect(this,lhs,&local_38,0xff00ffff,0.0,0,1.0);
    }
  }
  if ((window._5_1_ & 1) != 0) {
    bVar1 = true;
    if (*(long *)(label_local + 0x20) != 0) {
      bVar1 = *(char **)(*(long *)(label_local + 0x20) + 0x18) == label_local;
    }
    if (!bVar1) {
      __assert_fail("node->ChildNodes[0] == __null || node->ChildNodes[0]->ParentNode == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x4310,"void ImGui::DebugNodeDockNode(ImGuiDockNode *, const char *)");
    }
    bVar1 = true;
    if (*(long *)(label_local + 0x28) != 0) {
      bVar1 = *(char **)(*(long *)(label_local + 0x28) + 0x18) == label_local;
    }
    if (!bVar1) {
      __assert_fail("node->ChildNodes[1] == __null || node->ChildNodes[1]->ParentNode == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x4311,"void ImGui::DebugNodeDockNode(ImGuiDockNode *, const char *)");
    }
    BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
               (double)*(float *)(label_local + 0x48),(double)*(float *)(label_local + 0x4c),
               (double)*(float *)(label_local + 0x50),(double)*(float *)(label_local + 0x54),
               (double)*(float *)(label_local + 0x58),(double)*(float *)(label_local + 0x5c));
    DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x80),"HostWindow");
    DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x88),"VisibleWindow");
    BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X",
               (ulong)*(uint *)(label_local + 0xb4),(ulong)*(uint *)(label_local + 0xb0));
    bVar1 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)label_local);
    pcVar2 = "";
    if (bVar1) {
      pcVar2 = " IsDockSpace";
    }
    bVar1 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)label_local);
    pcVar5 = "";
    if (bVar1) {
      pcVar5 = " IsCentralNode";
    }
    pcVar4 = "";
    if ((window._7_1_ & 1) != 0) {
      pcVar4 = " IsAlive";
    }
    pcVar6 = "";
    if ((window._6_1_ & 1) != 0) {
      pcVar6 = " IsActive";
    }
    pcVar7 = "";
    if (*(short *)(label_local + 0xbc) < 0) {
      pcVar7 = " WantLockSizeOnce";
    }
    pcVar3 = "";
    if (((byte)((ushort)*(undefined2 *)(label_local + 0xbc) >> 0xd) & 1) != 0) {
      pcVar3 = " HasCentralNodeChild";
    }
    BulletText("Misc:%s%s%s%s%s%s",pcVar2,pcVar5,pcVar4,pcVar6,pcVar7,pcVar3);
    bVar1 = TreeNode("flags",
                     "Flags Merged: 0x%04X, Local: 0x%04X, InWindows: 0x%04X, Shared: 0x%04X",
                     (ulong)*(uint *)(label_local + 0x10),(ulong)*(uint *)(label_local + 8),
                     (ulong)*(uint *)(label_local + 0xc),(ulong)*(uint *)(label_local + 4));
    if (bVar1) {
      ImVec2::ImVec2(&local_40,0.0,0.0);
      bVar1 = BeginTable("flags",4,0,&local_40,0.0);
      if (bVar1) {
        TableNextColumn();
        DebugNodeDockNodeFlags((ImGuiDockNodeFlags *)(label_local + 0x10),"MergedFlags",false);
        TableNextColumn();
        DebugNodeDockNodeFlags((ImGuiDockNodeFlags *)(label_local + 8),"LocalFlags",true);
        TableNextColumn();
        DebugNodeDockNodeFlags
                  ((ImGuiDockNodeFlags *)(label_local + 0xc),"LocalFlagsInWindows",false);
        TableNextColumn();
        DebugNodeDockNodeFlags((ImGuiDockNodeFlags *)(label_local + 4),"SharedFlags",true);
        EndTable();
      }
      TreePop();
    }
    if (*(long *)(label_local + 0x18) != 0) {
      DebugNodeDockNode(*(ImGuiDockNode **)(label_local + 0x18),"ParentNode");
    }
    if (*(long *)(label_local + 0x20) != 0) {
      DebugNodeDockNode(*(ImGuiDockNode **)(label_local + 0x20),"Child[0]");
    }
    if (*(long *)(label_local + 0x28) != 0) {
      DebugNodeDockNode(*(ImGuiDockNode **)(label_local + 0x28),"Child[1]");
    }
    if (*(long *)(label_local + 0x40) != 0) {
      DebugNodeTabBar(*(ImGuiTabBar **)(label_local + 0x40),"TabBar");
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeDockNode(ImGuiDockNode* node, const char* label)
{
    ImGuiContext& g = *GImGui;
    const bool is_alive = (g.FrameCount - node->LastFrameAlive < 2);    // Submitted with ImGuiDockNodeFlags_KeepAliveOnly
    const bool is_active = (g.FrameCount - node->LastFrameActive < 2);  // Submitted
    if (!is_alive) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open;
    if (node->Windows.Size > 0)
        open = TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %d windows (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", node->Windows.Size, node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
    else
        open = TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %s split (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", (node->SplitAxis == ImGuiAxis_X) ? "horizontal" : (node->SplitAxis == ImGuiAxis_Y) ? "vertical" : "n/a", node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
    if (!is_alive) { PopStyleColor(); }
    if (is_active && IsItemHovered())
        if (ImGuiWindow* window = node->HostWindow ? node->HostWindow : node->VisibleWindow)
            GetForegroundDrawList(window)->AddRect(node->Pos, node->Pos + node->Size, IM_COL32(255, 255, 0, 255));
    if (open)
    {
        IM_ASSERT(node->ChildNodes[0] == NULL || node->ChildNodes[0]->ParentNode == node);
        IM_ASSERT(node->ChildNodes[1] == NULL || node->ChildNodes[1]->ParentNode == node);
        BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
            node->Pos.x, node->Pos.y, node->Size.x, node->Size.y, node->SizeRef.x, node->SizeRef.y);
        DebugNodeWindow(node->HostWindow, "HostWindow");
        DebugNodeWindow(node->VisibleWindow, "VisibleWindow");
        BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X", node->SelectedTabId, node->LastFocusedNodeId);
        BulletText("Misc:%s%s%s%s%s%s",
            node->IsDockSpace() ? " IsDockSpace" : "",
            node->IsCentralNode() ? " IsCentralNode" : "",
            is_alive ? " IsAlive" : "", is_active ? " IsActive" : "",
            node->WantLockSizeOnce ? " WantLockSizeOnce" : "",
            node->HasCentralNodeChild ? " HasCentralNodeChild" : "");
        if (TreeNode("flags", "Flags Merged: 0x%04X, Local: 0x%04X, InWindows: 0x%04X, Shared: 0x%04X", node->MergedFlags, node->LocalFlags, node->LocalFlagsInWindows, node->SharedFlags))
        {
            if (BeginTable("flags", 4))
            {
                TableNextColumn(); DebugNodeDockNodeFlags(&node->MergedFlags, "MergedFlags", false);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->LocalFlags, "LocalFlags", true);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->LocalFlagsInWindows, "LocalFlagsInWindows", false);
                TableNextColumn(); DebugNodeDockNodeFlags(&node->SharedFlags, "SharedFlags", true);
                EndTable();
            }
            TreePop();
        }
        if (node->ParentNode)
            DebugNodeDockNode(node->ParentNode, "ParentNode");
        if (node->ChildNodes[0])
            DebugNodeDockNode(node->ChildNodes[0], "Child[0]");
        if (node->ChildNodes[1])
            DebugNodeDockNode(node->ChildNodes[1], "Child[1]");
        if (node->TabBar)
            DebugNodeTabBar(node->TabBar, "TabBar");
        TreePop();
    }
}